

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream *dctx,ZSTD_DDict *ddict)

{
  dctx->streamStage = zdss_init;
  dctx->noForwardProgress = 0;
  ZSTD_freeDDict(dctx->ddictLocal);
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = ddict;
  return 5;
}

Assistant:

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream* dctx, const ZSTD_DDict* ddict)
{
    size_t const initResult = ZSTD_initDStream(dctx);
    dctx->ddict = ddict;
    return initResult;
}